

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::NamespacePrinter::NamespacePrinter
          (NamespacePrinter *this,Printer *p,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *namespace_components)

{
  pointer pbVar1;
  Printer *this_00;
  Printer **ppPVar2;
  Arg *in_R8;
  pointer pbVar3;
  string_view format;
  string_view text;
  string_view text_00;
  string local_88;
  Printer *p_local;
  size_type local_60;
  pointer local_58;
  
  p_local = p;
  ppPVar2 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::io::Printer*const&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/namespace_printer.cc"
                       ,0x12,"p",&p_local);
  this->p_ = *ppPVar2;
  pbVar3 = (namespace_components->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->namespace_components_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (namespace_components->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->namespace_components_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->namespace_components_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (namespace_components->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (namespace_components->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (namespace_components->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (namespace_components->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (this->namespace_components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->namespace_components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this_00 = this->p_, pbVar3 != pbVar1;
      pbVar3 = pbVar3 + 1) {
    local_58 = (pbVar3->_M_dataplus)._M_p;
    local_60 = pbVar3->_M_string_length;
    format._M_str = (char *)&local_60;
    format._M_len = (size_t)"namespace $0 {\n";
    absl::lts_20250127::Substitute_abi_cxx11_(&local_88,(lts_20250127 *)&DAT_0000000f,format,in_R8);
    text._M_str = local_88._M_dataplus._M_p;
    text._M_len = local_88._M_string_length;
    io::Printer::Print<>(this_00,text);
    std::__cxx11::string::~string((string *)&local_88);
  }
  text_00._M_str = "\n";
  text_00._M_len = 1;
  io::Printer::Print<>(this_00,text_00);
  return;
}

Assistant:

NamespacePrinter::NamespacePrinter(
    google::protobuf::io::Printer* const p, std::vector<std::string> namespace_components)
    : p_(ABSL_DIE_IF_NULL(p)),
      namespace_components_(std::move(namespace_components)) {
  // Open the namespace.
  for (const std::string& ns : namespace_components_) {
    p_->Print(absl::Substitute("namespace $0 {\n", ns));
  }
  p_->Print("\n");
}